

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::ReflectionSchema::IsFieldInlined
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long lVar1;
  uint32 *puVar2;
  Type TVar3;
  char *pcVar4;
  int in_EDX;
  byte bVar5;
  bool bVar6;
  
  lVar1 = *(long *)(field + 0x58);
  if (lVar1 == 0) {
    puVar2 = this->offsets_;
    pcVar4 = FieldDescriptor::index(field,(char *)field,in_EDX);
    bVar5 = (byte)puVar2[(int)pcVar4];
  }
  else {
    bVar5 = (byte)this->offsets_
                  [(long)(int)((lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) / 0x30) +
                   (long)*(int *)(*(long *)(field + 0x50) + 0x68)];
  }
  TVar3 = FieldDescriptor::type(field);
  if ((TVar3 == TYPE_BYTES) || (TVar3 == TYPE_STRING)) {
    bVar6 = (bool)(bVar5 & 1);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool IsFieldInlined(const FieldDescriptor* field) const {
    if (field->containing_oneof()) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return Inlined(offsets_[offset], field->type());
    } else {
      return Inlined(offsets_[field->index()], field->type());
    }
  }